

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O1

_Bool symop_char(int32_t c)

{
  int32_t offset;
  uint uVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  ulong uVar4;
  
  if (c < 0x21) {
    return false;
  }
  if (c < 0x4e00) {
    uVar1 = c - 0x21;
    uVar4 = (ulong)(uVar1 >> 3);
    puVar2 = "\x7f~";
  }
  else {
    if (c < 0xa490) {
      return false;
    }
    if (c < 0xabec) {
      pbVar3 = bitmap_symop_2 + (c - 0xa490U >> 3);
      uVar1 = c;
      goto LAB_0010a64f;
    }
    if (c < 0xfb29) {
      return false;
    }
    if (c < 0x12ff3) {
      uVar1 = c - 0xfb29;
      uVar4 = (ulong)(uVar1 >> 3);
      puVar2 = "\x01";
    }
    else {
      if (c < 0x16a6e) {
        return false;
      }
      if (c < 0x16fe3) {
        uVar1 = c - 0x16a6e;
        uVar4 = (ulong)(uVar1 >> 3);
        puVar2 = "\x03";
      }
      else {
        uVar1 = c - 0x1bc9c;
        if (0x3f2e < uVar1) {
          return false;
        }
        uVar4 = (ulong)(uVar1 >> 3);
        puVar2 = "\t";
      }
    }
  }
  pbVar3 = puVar2 + uVar4;
LAB_0010a64f:
  if ((*pbVar3 >> (uVar1 & 7) & 1) == 0) {
    return false;
  }
  if ((((0x3e < c - 0x22U) || ((0x6a000000020004e1U >> ((ulong)(c - 0x22U) & 0x3f) & 1) == 0)) &&
      (c != 0x7b)) && (c != 0x7d)) {
    return true;
  }
  return false;
}

Assistant:

static bool is_symop_char(int32_t c) {
  return
    c < bitmap_symop_1_min_codepoint ? false :
    c <= bitmap_symop_1_max_codepoint ? is_symop_1_char(c) :
    c < bitmap_symop_2_min_codepoint ? false :
    c <= bitmap_symop_2_max_codepoint ? is_symop_2_char(c) :
    c < bitmap_symop_3_min_codepoint ? false :
    c <= bitmap_symop_3_max_codepoint ? is_symop_3_char(c) :
    c < bitmap_symop_4_min_codepoint ? false :
    c <= bitmap_symop_4_max_codepoint ? is_symop_4_char(c) :
    c < bitmap_symop_5_min_codepoint ? false :
    c <= bitmap_symop_5_max_codepoint ? is_symop_5_char(c) :
    false;
}